

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderCommonFunctionTests.cpp
# Opt level: O1

bool __thiscall
deqp::gles31::Functional::AbsCase::compare(AbsCase *this,void **inputs,void **outputs)

{
  float fVar1;
  DataType dataType;
  Precision PVar2;
  int iVar3;
  pointer pSVar4;
  int iVar5;
  ostream *poVar6;
  ostringstream *poVar7;
  int iVar8;
  long lVar9;
  uint uVar10;
  deUint32 u32;
  HexFloat local_3c;
  float local_38;
  undefined4 uStack_34;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  
  pSVar4 = (this->super_CommonFunctionCase).m_spec.inputs.
           super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
           ._M_impl.super__Vector_impl_data._M_start;
  dataType = (pSVar4->varType).m_data.basic.type;
  PVar2 = (pSVar4->varType).m_data.basic.precision;
  iVar5 = glu::getDataTypeScalarSize(dataType);
  if (dataType - TYPE_FLOAT < 4) {
    if (0 < iVar5) {
      lVar9 = 0;
      do {
        fVar1 = *(float *)((long)*inputs + lVar9 * 4);
        local_38 = -fVar1;
        if (-fVar1 <= fVar1) {
          local_38 = fVar1;
        }
        fVar1 = *(float *)((long)*outputs + lVar9 * 4);
        uVar10 = (int)local_38 - (int)fVar1;
        if ((uint)local_38 < (uint)fVar1) {
          uVar10 = -((int)local_38 - (int)fVar1);
        }
        if ((uint)~(-1 << (0x17 - (&DAT_00986d1c)[(ulong)PVar2 * 4] & 0x1f)) < uVar10) {
          poVar7 = &(this->super_CommonFunctionCase).m_failMsg;
          uStack_34 = 0x80000000;
          uStack_30 = 0x80000000;
          uStack_2c = 0x80000000;
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar7,"Expected [",10);
          poVar6 = (ostream *)std::ostream::operator<<(poVar7,(int)lVar9);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"] = ",4);
          local_3c.value = local_38;
          poVar6 = Functional::operator<<(poVar6,&local_3c);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6," with ULP threshold ",0x14);
          poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,", got ULP diff ",0xf);
          std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
          return false;
        }
        lVar9 = lVar9 + 1;
      } while (iVar5 != (int)lVar9);
    }
  }
  else if (0 < iVar5) {
    lVar9 = 0;
    do {
      iVar3 = *(int *)((long)*inputs + lVar9 * 4);
      iVar8 = -iVar3;
      if (0 < iVar3) {
        iVar8 = iVar3;
      }
      if (*(int *)((long)*outputs + lVar9 * 4) != iVar8) {
        poVar7 = &(this->super_CommonFunctionCase).m_failMsg;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar7,"Expected [",10);
        poVar6 = (ostream *)std::ostream::operator<<(poVar7,(int)lVar9);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"] = ",4);
        std::ostream::operator<<(poVar6,iVar8);
        return false;
      }
      lVar9 = lVar9 + 1;
    } while (iVar5 != (int)lVar9);
  }
  return true;
}

Assistant:

bool compare (const void* const* inputs, const void* const* outputs)
	{
		const glu::DataType		type			= m_spec.inputs[0].varType.getBasicType();
		const glu::Precision	precision		= m_spec.inputs[0].varType.getPrecision();
		const int				scalarSize		= glu::getDataTypeScalarSize(type);

		if (glu::isDataTypeFloatOrVec(type))
		{
			const int		mantissaBits	= getMinMantissaBits(precision);
			const deUint32	maxUlpDiff		= (1u<<(23-mantissaBits))-1u;

			for (int compNdx = 0; compNdx < scalarSize; compNdx++)
			{
				const float		in0			= ((const float*)inputs[0])[compNdx];
				const float		out0		= ((const float*)outputs[0])[compNdx];
				const float		ref0		= de::abs(in0);
				const deUint32	ulpDiff0	= getUlpDiff(out0, ref0);

				if (ulpDiff0 > maxUlpDiff)
				{
					m_failMsg << "Expected [" << compNdx << "] = " << HexFloat(ref0) << " with ULP threshold " << maxUlpDiff << ", got ULP diff " << ulpDiff0;
					return false;
				}
			}
		}
		else
		{
			for (int compNdx = 0; compNdx < scalarSize; compNdx++)
			{
				const int	in0		= ((const int*)inputs[0])[compNdx];
				const int	out0	= ((const int*)outputs[0])[compNdx];
				const int	ref0	= de::abs(in0);

				if (out0 != ref0)
				{
					m_failMsg << "Expected [" << compNdx << "] = " << ref0;
					return false;
				}
			}
		}

		return true;
	}